

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<int,_int>_>::erase
          (Span<QHashPrivate::MultiNode<int,_int>_> *this,size_t bucket)

{
  byte bVar1;
  uchar uVar2;
  uchar *puVar3;
  long in_RSI;
  MultiNode<int,_int> *in_RDI;
  uchar entry;
  
  bVar1 = *(byte *)((long)&in_RDI->key + in_RSI);
  *(undefined1 *)((long)&in_RDI->key + in_RSI) = 0xff;
  Entry::node((Entry *)(*(long *)(in_RDI + 8) + (ulong)bVar1 * 0x10));
  MultiNode<int,_int>::~MultiNode(in_RDI);
  uVar2 = *(uchar *)((long)&in_RDI[8].value + 1);
  puVar3 = Entry::nextFree((Entry *)(*(long *)(in_RDI + 8) + (ulong)bVar1 * 0x10));
  *puVar3 = uVar2;
  *(byte *)((long)&in_RDI[8].value + 1) = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }